

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outsmesh(tetgenmesh *this,char *smfilename)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  point pt;
  point pt_00;
  point pt_01;
  bool local_876;
  bool local_875;
  int local_874;
  int local_864;
  uint local_860;
  int i;
  int marker;
  int bmark;
  int shift;
  int firstindex;
  point p3;
  point p2;
  point p1;
  face faceloop;
  char smefilename [1024];
  char nodfilename [1024];
  FILE *outfile;
  char *smfilename_local;
  tetgenmesh *this_local;
  
  face::face((face *)&p1);
  if ((smfilename == (char *)0x0) || (*smfilename == '\0')) {
    if (this->b->outfilename[0] == '\0') {
      strcpy((char *)&faceloop.shver,"unnamed");
    }
    else {
      strcpy((char *)&faceloop.shver,this->b->outfilename);
    }
  }
  else {
    strcpy((char *)&faceloop.shver,smfilename);
  }
  strcpy(smefilename + 0x3f8,(char *)&faceloop.shver);
  strcat((char *)&faceloop.shver,".smesh");
  strcat(smefilename + 0x3f8,".node");
  if (this->b->quiet == 0) {
    printf("Writing %s.\n",&faceloop.shver);
  }
  __stream = fopen((char *)&faceloop.shver,"w");
  if (__stream == (FILE *)0x0) {
    printf("File I/O Error:  Cannot create file %s.\n",&faceloop.shver);
  }
  else {
    if (this->b->zeroindex == 0) {
      local_874 = this->in->firstnumber;
    }
    else {
      local_874 = 0;
    }
    marker = 0;
    if ((this->in->firstnumber == 1) && (local_874 == 0)) {
      marker = 1;
    }
    fprintf(__stream,"# %s.  TetGen\'s input file.\n",&faceloop.shver);
    fprintf(__stream,"\n# part 1: node list.\n");
    fprintf(__stream,"0  3  0  0  # nodes are found in %s.\n",smefilename + 0x3f8);
    local_860 = 0;
    local_875 = false;
    if (this->b->nobound == 0) {
      local_876 = true;
      if (this->in->facetmarkerlist == (int *)0x0) {
        local_876 = this->in->trifacemarkerlist != (int *)0x0;
      }
      local_875 = local_876;
    }
    uVar1 = (uint)local_875;
    fprintf(__stream,"\n# part 2: facet list.\n");
    fprintf(__stream,"%ld  %d\n",this->subfaces->items,(ulong)uVar1);
    memorypool::traversalinit(this->subfaces);
    p1 = (point)shellfacetraverse(this,this->subfaces);
    while (p1 != (point)0x0) {
      pt = sorg(this,(face *)&p1);
      pt_00 = sdest(this,(face *)&p1);
      pt_01 = sapex(this,(face *)&p1);
      if (uVar1 != 0) {
        local_860 = shellmark(this,(face *)&p1);
      }
      iVar2 = pointmark(this,pt);
      iVar3 = pointmark(this,pt_00);
      iVar4 = pointmark(this,pt_01);
      fprintf(__stream,"3    %4d  %4d  %4d",(ulong)(uint)(iVar2 - marker),
              (ulong)(uint)(iVar3 - marker),(ulong)(uint)(iVar4 - marker));
      if (uVar1 != 0) {
        fprintf(__stream,"    %d",(ulong)local_860);
      }
      fprintf(__stream,"\n");
      p1 = (point)shellfacetraverse(this,this->subfaces);
    }
    fprintf(__stream,"\n# part 3: hole list.\n");
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofholes);
    for (local_864 = 0; local_864 < this->in->numberofholes; local_864 = local_864 + 1) {
      fprintf(__stream,"%d  %g  %g  %g\n",this->in->holelist[local_864 * 3],
              this->in->holelist[local_864 * 3 + 1],this->in->holelist[local_864 * 3 + 2],
              (ulong)(uint)(local_864 + this->in->firstnumber));
    }
    fprintf(__stream,"\n# part 4: region list.\n");
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofregions);
    for (local_864 = 0; local_864 < this->in->numberofregions; local_864 = local_864 + 1) {
      fprintf(__stream,"%d  %g  %g  %g  %d  %g\n",this->in->regionlist[local_864 * 5],
              this->in->regionlist[local_864 * 5 + 1],this->in->regionlist[local_864 * 5 + 2],
              this->in->regionlist[local_864 * 5 + 4],
              (ulong)(uint)(local_864 + this->in->firstnumber),
              (ulong)(uint)(int)this->in->regionlist[local_864 * 5 + 3]);
    }
    fprintf(__stream,"# Generated by %s\n",this->b->commandline);
    fclose(__stream);
  }
  return;
}

Assistant:

void tetgenmesh::outsmesh(char* smfilename)
{
  FILE *outfile;
  char nodfilename[FILENAMESIZE];
  char smefilename[FILENAMESIZE];
  face faceloop;
  point p1, p2, p3;
  int firstindex, shift;
  int bmark;
  int marker;
  int i;

  if (smfilename != (char *) NULL && smfilename[0] != '\0') {
    strcpy(smefilename, smfilename);
  } else if (b->outfilename[0] != '\0') {
    strcpy(smefilename, b->outfilename);
  } else {
    strcpy(smefilename, "unnamed");
  }
  strcpy(nodfilename, smefilename);
  strcat(smefilename, ".smesh");
  strcat(nodfilename, ".node");

  if (!b->quiet) {
    printf("Writing %s.\n", smefilename);
  }
  outfile = fopen(smefilename, "w");
  if (outfile == (FILE *) NULL) {
    printf("File I/O Error:  Cannot create file %s.\n", smefilename);
    return;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  fprintf(outfile, "# %s.  TetGen's input file.\n", smefilename);
  fprintf(outfile, "\n# part 1: node list.\n");
  fprintf(outfile, "0  3  0  0  # nodes are found in %s.\n", nodfilename);

  marker = 0; // avoid compile warning.
  bmark = !b->nobound && (in->facetmarkerlist || in->trifacemarkerlist);  

  fprintf(outfile, "\n# part 2: facet list.\n");
  // Number of facets, boundary marker.
  fprintf(outfile, "%ld  %d\n", subfaces->items, bmark);
  
  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  while (faceloop.sh != (shellface *) NULL) {
    p1 = sorg(faceloop);
    p2 = sdest(faceloop);
    p3 = sapex(faceloop);
    if (bmark) {
      marker = shellmark(faceloop);
    }
    fprintf(outfile, "3    %4d  %4d  %4d", pointmark(p1) - shift,
            pointmark(p2) - shift, pointmark(p3) - shift);
    if (bmark) {
      fprintf(outfile, "    %d", marker);
    }
    fprintf(outfile, "\n");
    faceloop.sh = shellfacetraverse(subfaces);
  }

  // Copy input holelist.
  fprintf(outfile, "\n# part 3: hole list.\n");
  fprintf(outfile, "%d\n", in->numberofholes);
  for (i = 0; i < in->numberofholes; i++) {
    fprintf(outfile, "%d  %g  %g  %g\n", i + in->firstnumber,
            in->holelist[i * 3], in->holelist[i * 3 + 1],
            in->holelist[i * 3 + 2]);
  }

  // Copy input regionlist.
  fprintf(outfile, "\n# part 4: region list.\n");
  fprintf(outfile, "%d\n", in->numberofregions);
  for (i = 0; i < in->numberofregions; i++) {
    fprintf(outfile, "%d  %g  %g  %g  %d  %g\n", i + in->firstnumber,
            in->regionlist[i * 5], in->regionlist[i * 5 + 1],
            in->regionlist[i * 5 + 2], (int) in->regionlist[i * 5 + 3],
            in->regionlist[i * 5 + 4]);
  }

  fprintf(outfile, "# Generated by %s\n", b->commandline);
  fclose(outfile);
}